

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

void __thiscall cmQtAutoGenerator::Logger::Info(Logger *this,GenT genType,string *message)

{
  string *psVar1;
  lock_guard<std::mutex> lock;
  string msg;
  
  psVar1 = cmQtAutoGen::GeneratorName_abi_cxx11_(genType);
  std::__cxx11::string::string((string *)&msg,(string *)psVar1);
  std::__cxx11::string::append((char *)&msg);
  std::__cxx11::string::append((string *)&msg);
  if (msg._M_dataplus._M_p[msg._M_string_length - 1] != '\n') {
    std::__cxx11::string::push_back((char)&msg);
  }
  std::mutex::lock(&this->Mutex_);
  cmSystemTools::Stdout(&msg);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  std::__cxx11::string::~string((string *)&msg);
  return;
}

Assistant:

void cmQtAutoGenerator::Logger::Info(GenT genType,
                                     std::string const& message) const
{
  std::string msg = GeneratorName(genType);
  msg += ": ";
  msg += message;
  if (msg.back() != '\n') {
    msg.push_back('\n');
  }
  {
    std::lock_guard<std::mutex> lock(Mutex_);
    cmSystemTools::Stdout(msg);
  }
}